

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadCodeMetadataSection
          (BinaryReader *this,string_view name,Offset section_size)

{
  Index IVar1;
  bool bVar2;
  Index IVar3;
  Result RVar4;
  void *local_a0;
  void *data;
  Address data_size;
  ulong local_88;
  Offset code_offset;
  ulong uStack_78;
  Index j;
  Offset last_code_offset;
  uint local_68;
  Enum local_64;
  Index num_metadata;
  uint local_5c;
  Index function_index;
  Index i;
  Index last_function_index;
  uint local_4c;
  BinaryReader *pBStack_48;
  Index num_functions;
  char *local_40;
  Enum local_34;
  Offset local_30;
  Offset section_size_local;
  BinaryReader *this_local;
  string_view name_local;
  
  local_40 = name._M_str;
  pBStack_48 = (BinaryReader *)name._M_len;
  local_30 = section_size;
  section_size_local = (Offset)this;
  this_local = pBStack_48;
  name_local._M_len = (size_t)local_40;
  local_34 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xdd])
                       (this->delegate_,pBStack_48,local_40,section_size);
  bVar2 = Succeeded((Result)local_34);
  if (bVar2) {
    last_function_index = (Index)ReadCount(this,&local_4c,"function count");
    bVar2 = Failed((Result)last_function_index);
    if (bVar2) {
      Result::Result((Result *)((long)&name_local._M_str + 4),Error);
    }
    else {
      i = (*this->delegate_->_vptr_BinaryReaderDelegate[0xde])();
      bVar2 = Succeeded((Result)i);
      if (bVar2) {
        function_index = 0xffffffff;
        for (local_5c = 0; local_5c < local_4c; local_5c = local_5c + 1) {
          local_64 = (Enum)ReadCount(this,&num_metadata,"function index");
          bVar2 = Failed((Result)local_64);
          IVar1 = num_metadata;
          if (bVar2) {
            Result::Result((Result *)((long)&name_local._M_str + 4),Error);
            return (Result)name_local._M_str._4_4_;
          }
          if (num_metadata < this->num_func_imports_) {
            PrintError(this,"function import can\'t have metadata (got %u)",(ulong)num_metadata);
            Result::Result((Result *)((long)&name_local._M_str + 4),Error);
            return (Result)name_local._M_str._4_4_;
          }
          IVar3 = NumTotalFuncs(this);
          if (IVar3 <= IVar1) {
            PrintError(this,"invalid function index: %u",(ulong)num_metadata);
            Result::Result((Result *)((long)&name_local._M_str + 4),Error);
            return (Result)name_local._M_str._4_4_;
          }
          if (num_metadata == function_index) {
            PrintError(this,"duplicate function index: %u",(ulong)num_metadata);
            Result::Result((Result *)((long)&name_local._M_str + 4),Error);
            return (Result)name_local._M_str._4_4_;
          }
          if ((function_index != 0xffffffff) && (num_metadata <= function_index)) {
            PrintError(this,"function index out of order: %u",(ulong)num_metadata);
            Result::Result((Result *)((long)&name_local._M_str + 4),Error);
            return (Result)name_local._M_str._4_4_;
          }
          function_index = num_metadata;
          last_code_offset._4_4_ = ReadCount(this,&local_68,"metadata instances count");
          bVar2 = Failed(last_code_offset._4_4_);
          if (bVar2) {
            Result::Result((Result *)((long)&name_local._M_str + 4),Error);
            return (Result)name_local._M_str._4_4_;
          }
          last_code_offset._0_4_ =
               (*this->delegate_->_vptr_BinaryReaderDelegate[0xdf])
                         (this->delegate_,(ulong)num_metadata,(ulong)local_68);
          bVar2 = Succeeded(last_code_offset._0_4_);
          if (!bVar2) {
            PrintError(this,"OnCodeMetadataCount callback failed");
            Result::Result((Result *)((long)&name_local._M_str + 4),Error);
            return (Result)name_local._M_str._4_4_;
          }
          uStack_78 = 0xffffffffffffffff;
          for (code_offset._4_4_ = 0; code_offset._4_4_ < local_68;
              code_offset._4_4_ = code_offset._4_4_ + 1) {
            data_size._4_4_ = ReadOffset(this,&local_88,"code offset");
            bVar2 = Failed(data_size._4_4_);
            if (bVar2) {
              Result::Result((Result *)((long)&name_local._M_str + 4),Error);
              return (Result)name_local._M_str._4_4_;
            }
            if (local_88 == uStack_78) {
              PrintError(this,"duplicate code offset: %zx",local_88);
              Result::Result((Result *)((long)&name_local._M_str + 4),Error);
              return (Result)name_local._M_str._4_4_;
            }
            if ((uStack_78 != 0xffffffffffffffff) && (local_88 <= uStack_78)) {
              PrintError(this,"code offset out of order: %zx",local_88);
              Result::Result((Result *)((long)&name_local._M_str + 4),Error);
              return (Result)name_local._M_str._4_4_;
            }
            uStack_78 = local_88;
            RVar4 = ReadBytes(this,&local_a0,(Address *)&data,"instance data");
            bVar2 = Failed(RVar4);
            if (bVar2) {
              Result::Result((Result *)((long)&name_local._M_str + 4),Error);
              return (Result)name_local._M_str._4_4_;
            }
            RVar4.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xe0])
                                    (this->delegate_,local_88,local_a0,data);
            bVar2 = Succeeded(RVar4);
            if (!bVar2) {
              PrintError(this,"OnCodeMetadata callback failed");
              Result::Result((Result *)((long)&name_local._M_str + 4),Error);
              return (Result)name_local._M_str._4_4_;
            }
          }
        }
        RVar4.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xe1])();
        bVar2 = Succeeded(RVar4);
        if (bVar2) {
          Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
        }
        else {
          PrintError(this,"EndCodeMetadataSection callback failed");
          Result::Result((Result *)((long)&name_local._M_str + 4),Error);
        }
      }
      else {
        PrintError(this,"OnCodeMetadataFuncCount callback failed");
        Result::Result((Result *)((long)&name_local._M_str + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginCodeMetadataSection callback failed");
    Result::Result((Result *)((long)&name_local._M_str + 4),Error);
  }
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result BinaryReader::ReadCodeMetadataSection(std::string_view name,
                                             Offset section_size) {
  CALLBACK(BeginCodeMetadataSection, name, section_size);

  Index num_functions;
  CHECK_RESULT(ReadCount(&num_functions, "function count"));
  CALLBACK(OnCodeMetadataFuncCount, num_functions);

  Index last_function_index = kInvalidIndex;
  for (Index i = 0; i < num_functions; ++i) {
    Index function_index;
    CHECK_RESULT(ReadCount(&function_index, "function index"));
    ERROR_UNLESS(function_index >= num_func_imports_,
                 "function import can't have metadata (got %" PRIindex ")",
                 function_index);
    ERROR_UNLESS(function_index < NumTotalFuncs(),
                 "invalid function index: %" PRIindex, function_index);
    ERROR_UNLESS(function_index != last_function_index,
                 "duplicate function index: %" PRIindex, function_index);
    ERROR_UNLESS(last_function_index == kInvalidIndex ||
                     function_index > last_function_index,
                 "function index out of order: %" PRIindex, function_index);
    last_function_index = function_index;

    Index num_metadata;
    CHECK_RESULT(ReadCount(&num_metadata, "metadata instances count"));

    CALLBACK(OnCodeMetadataCount, function_index, num_metadata);

    Offset last_code_offset = kInvalidOffset;
    for (Index j = 0; j < num_metadata; ++j) {
      Offset code_offset;
      CHECK_RESULT(ReadOffset(&code_offset, "code offset"));
      ERROR_UNLESS(code_offset != last_code_offset,
                   "duplicate code offset: %" PRIzx, code_offset);
      ERROR_UNLESS(
          last_code_offset == kInvalidOffset || code_offset > last_code_offset,
          "code offset out of order: %" PRIzx, code_offset);
      last_code_offset = code_offset;

      Address data_size;
      const void* data;
      CHECK_RESULT(ReadBytes(&data, &data_size, "instance data"));
      CALLBACK(OnCodeMetadata, code_offset, data, data_size);
    }
  }

  CALLBACK(EndCodeMetadataSection);
  return Result::Ok;
}